

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

void fmt::v9::detail::convert_arg<void,fmt::v9::basic_printf_context<fmt::v9::appender,char>,char>
               (basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *arg,
               char type)

{
  longlong lVar1;
  size_t sVar2;
  type tVar3;
  arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> local_10;
  
  local_10.arg_ = arg;
  local_10.type_ = type;
  switch(arg->type_) {
  case int_type:
  case uint_type:
    *(ulong *)&(arg->value_).field_0 = (ulong)(arg->value_).field_0.uint_value;
    arg->type_ = uint_type - (type == 'd' || type == 'i');
    break;
  case long_long_type:
  case ulong_long_type:
    arg->type_ = ulong_long_type - (type == 'd' || type == 'i');
    break;
  case int128_type:
  case uint128_type:
    lVar1 = (arg->value_).field_0.long_long_value;
    if ((type == 'i') || (type == 'd')) {
      (arg->value_).field_0.long_long_value = lVar1;
      tVar3 = long_long_type;
    }
    else {
      sVar2 = (arg->value_).field_0.string.size;
      (arg->value_).field_0.long_long_value = lVar1;
      (arg->value_).field_0.string.size = sVar2;
      tVar3 = uint128_type;
    }
    arg->type_ = tVar3;
    break;
  case bool_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::operator()
              (&local_10,(arg->value_).field_0.bool_value);
    break;
  case char_type:
    arg_converter<void,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<char,_0>(&local_10,(arg->value_).field_0.char_value);
  }
  return;
}

Assistant:

void convert_arg(basic_format_arg<Context>& arg, Char type) {
  visit_format_arg(arg_converter<T, Context>(arg, type), arg);
}